

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRConstant * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::
allocate<unsigned_int&,spirv_cross::SPIRConstant_const*(&)[4],unsigned_int&,bool>
          (ObjectPool<spirv_cross::SPIRConstant> *this,uint *p,SPIRConstant *(*p_1) [4],uint *p_2,
          bool *p_3)

{
  size_t sVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRConstant_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
  _Var2;
  uint uVar3;
  _Head_base<0UL,_spirv_cross::SPIRConstant_*,_false> _Var4;
  SPIRConstant *this_00;
  ulong uVar5;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size == 0) {
    uVar3 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>)malloc((ulong)uVar3 * 0x168);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl !=
        (SPIRConstant *)0x0) {
      if (uVar3 != 0) {
        uVar5 = (ulong)uVar3;
        _Var4._M_head_impl =
             (SPIRConstant *)
             _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl;
        do {
          SmallVector<spirv_cross::SPIRConstant_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size + 1);
          sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.ptr[sVar1] =
               _Var4._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size = sVar1 + 1;
          _Var4._M_head_impl = _Var4._M_head_impl + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRConstant_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false> =
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl !=
          (SPIRConstant *)0x0) goto LAB_002ceae1;
    }
    this_00 = (SPIRConstant *)0x0;
  }
  else {
LAB_002ceae1:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
    this_00 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRConstant_*,_0UL>::resize(&this->vacants,sVar1 - 1);
    }
    SPIRConstant::SPIRConstant(this_00,(TypeID)*p,*p_1,*p_2,*p_3);
  }
  return this_00;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}